

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O0

void google::protobuf::compiler::php::anon_unknown_2::GenerateMessageToPool
               (string_view name_prefix,Descriptor *message,Printer *printer)

{
  string_view sVar1;
  undefined8 uVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  MessageOptions *this;
  DescriptorStringView psVar7;
  FileDescriptor *pFVar8;
  OneofDescriptor *pOVar9;
  char *pcVar10;
  Descriptor *message_00;
  EnumDescriptor *en;
  undefined1 uVar11;
  char *pcVar12;
  AlphaNum *a;
  FieldDescriptor *field_00;
  AlphaNum *a_00;
  AlphaNum *a_01;
  FileDescriptor *in_R8;
  string_view classname;
  string_view s;
  string_view s_00;
  string_view s_01;
  string_view s_02;
  int local_4e4;
  int i_3;
  int local_4cc;
  undefined1 auStack_4c8 [4];
  int i_2;
  string_view local_4b8;
  string_view local_4a8;
  string local_498;
  AlphaNum local_478;
  string local_448;
  basic_string_view<char,_std::char_traits<char>_> local_428;
  string local_418;
  string_view local_3f8;
  FieldDescriptor *local_3e8;
  FieldDescriptor *field_1;
  undefined1 auStack_3d8 [4];
  int index;
  OneofDescriptor *local_3c8;
  OneofDescriptor *oneof;
  undefined1 local_3b8 [4];
  int i_1;
  AlphaNum local_398;
  string local_368;
  basic_string_view<char,_std::char_traits<char>_> local_348;
  string local_338;
  string local_318;
  string_view local_2f8;
  string local_2e8;
  AlphaNum local_2c8;
  string local_298;
  basic_string_view<char,_std::char_traits<char>_> local_278;
  string local_268;
  basic_string_view<char,_std::char_traits<char>_> local_248;
  string local_238;
  string_view local_218;
  FieldDescriptor *local_208;
  FieldDescriptor *val;
  FieldDescriptor *key;
  FieldDescriptor *field;
  undefined1 local_1e8 [4];
  int i;
  string_view local_1c8;
  AlphaNum local_1b8;
  undefined1 local_188 [16];
  string local_178;
  AlphaNum local_158;
  AlphaNum local_128;
  Descriptor *local_f8;
  size_t sStack_f0;
  AlphaNum local_e0;
  byte local_9a;
  allocator<char> local_99;
  undefined1 local_98 [80];
  undefined1 local_48 [8];
  string class_name;
  Printer *printer_local;
  Descriptor *message_local;
  string_view name_prefix_local;
  
  name_prefix_local._M_len = (size_t)name_prefix._M_str;
  message_local = (Descriptor *)name_prefix._M_len;
  class_name.field_2._8_8_ = printer;
  this = Descriptor::options(message);
  bVar3 = MessageOptions::map_entry(this);
  if (!bVar3) {
    bVar3 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                      ((basic_string_view<char,_std::char_traits<char>_> *)&message_local);
    local_9a = 0;
    if (bVar3) {
      std::allocator<char>::allocator();
      local_9a = 1;
      std::__cxx11::string::string<std::allocator<char>>((string *)local_98,"",&local_99);
    }
    else {
      local_f8 = message_local;
      sStack_f0 = name_prefix_local._M_len;
      sVar1._M_str = (char *)name_prefix_local._M_len;
      sVar1._M_len = (size_t)message_local;
      absl::lts_20240722::AlphaNum::AlphaNum(&local_e0,sVar1);
      absl::lts_20240722::AlphaNum::AlphaNum(&local_128,"\\");
      absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)local_98,&local_e0);
    }
    absl::lts_20240722::AlphaNum::AlphaNum<std::allocator<char>>
              ((AlphaNum *)(local_98 + 0x20),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98);
    psVar7 = Descriptor::name_abi_cxx11_(message);
    local_188 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar7);
    pFVar8 = Descriptor::file(message);
    classname._M_str = (char *)pFVar8;
    classname._M_len = local_188._8_8_;
    ReservedNamePrefix_abi_cxx11_(&local_178,(php *)local_188._0_8_,classname,in_R8);
    absl::lts_20240722::AlphaNum::AlphaNum<std::allocator<char>>(&local_158,&local_178);
    psVar7 = Descriptor::name_abi_cxx11_(message);
    absl::lts_20240722::AlphaNum::AlphaNum<std::allocator<char>>(&local_1b8,psVar7);
    absl::lts_20240722::StrCat_abi_cxx11_
              ((AlphaNum *)local_48,(AlphaNum *)(local_98 + 0x20),&local_158);
    std::__cxx11::string::~string((string *)&local_178);
    std::__cxx11::string::~string((string *)local_98);
    if ((local_9a & 1) != 0) {
      std::allocator<char>::~allocator(&local_99);
    }
    uVar2 = class_name.field_2._8_8_;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_1c8,
               "$pool->addMessage(\'^message^\', \\Google\\Protobuf\\Internal\\^class_name^::class)\n"
              );
    DescriptorFullName<google::protobuf::Descriptor>((string *)local_1e8,message,true);
    io::Printer::Print<char[8],std::__cxx11::string,char[11],std::__cxx11::string>
              ((Printer *)uVar2,local_1c8,(char (*) [8])0x649496,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e8,
               (char (*) [11])0x69bc0c,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48);
    std::__cxx11::string::~string((string *)local_1e8);
    Indent((Printer *)class_name.field_2._8_8_);
    field._4_4_ = 0;
    while( true ) {
      iVar5 = field._4_4_;
      uVar4 = Descriptor::field_count(message);
      pcVar12 = (char *)(ulong)uVar4;
      if ((int)uVar4 <= iVar5) break;
      key = Descriptor::field(message,field._4_4_);
      bVar3 = FieldDescriptor::is_map(key);
      if (bVar3) {
        google::protobuf::FieldDescriptor::message_type();
        val = (FieldDescriptor *)google::protobuf::Descriptor::map_key();
        google::protobuf::FieldDescriptor::message_type();
        local_208 = (FieldDescriptor *)google::protobuf::Descriptor::map_value();
        uVar2 = class_name.field_2._8_8_;
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (&local_218,
                   "->map(\'^field^\', \\Google\\Protobuf\\Internal\\GPBType::^key^, \\Google\\Protobuf\\Internal\\GPBType::^value^, ^number^^other^)\n"
                  );
        psVar7 = FieldDescriptor::name_abi_cxx11_(key);
        pcVar10 = FieldDescriptor::type_name(val);
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_248,pcVar10)
        ;
        s._M_str = pcVar12;
        s._M_len = (size_t)local_248._M_str;
        absl::lts_20240722::AsciiStrToUpper_abi_cxx11_
                  (&local_238,(lts_20240722 *)local_248._M_len,s);
        pcVar10 = FieldDescriptor::type_name(local_208);
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_278,pcVar10)
        ;
        s_00._M_str = pcVar12;
        s_00._M_len = (size_t)local_278._M_str;
        absl::lts_20240722::AsciiStrToUpper_abi_cxx11_
                  (&local_268,(lts_20240722 *)local_278._M_len,s_00);
        uVar11 = SUB81(pcVar12,0);
        iVar5 = FieldDescriptor::number(key);
        absl::lts_20240722::AlphaNum::AlphaNum(&local_2c8,iVar5);
        absl::lts_20240722::StrCat_abi_cxx11_(&local_298,(lts_20240722 *)&local_2c8,a);
        (anonymous_namespace)::EnumOrMessageSuffix_abi_cxx11_
                  (&local_2e8,(_anonymous_namespace_ *)local_208,(FieldDescriptor *)0x1,(bool)uVar11
                  );
        io::Printer::
        Print<char[6],std::__cxx11::string,char[4],std::__cxx11::string,char[6],std::__cxx11::string,char[7],std::__cxx11::string,char[6],std::__cxx11::string>
                  ((Printer *)uVar2,local_218,(char (*) [6])0x5a4b86,psVar7,(char (*) [4])0x6add57,
                   &local_238,(char (*) [6])0x69683e,&local_268,(char (*) [7])0x6bb261,&local_298,
                   (char (*) [6])"other",&local_2e8);
        std::__cxx11::string::~string((string *)&local_2e8);
        std::__cxx11::string::~string((string *)&local_298);
        std::__cxx11::string::~string((string *)&local_268);
        std::__cxx11::string::~string((string *)&local_238);
      }
      else {
        pOVar9 = FieldDescriptor::real_containing_oneof(key);
        uVar2 = class_name.field_2._8_8_;
        if (pOVar9 == (OneofDescriptor *)0x0) {
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    (&local_2f8,
                     "->^label^(\'^field^\', \\Google\\Protobuf\\Internal\\GPBType::^type^, ^number^^other^)\n"
                    );
          psVar7 = FieldDescriptor::name_abi_cxx11_(key);
          (anonymous_namespace)::LabelForField_abi_cxx11_
                    (&local_318,(_anonymous_namespace_ *)key,field_00);
          pcVar10 = FieldDescriptor::type_name(key);
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    (&local_348,pcVar10);
          s_01._M_str = pcVar12;
          s_01._M_len = (size_t)local_348._M_str;
          absl::lts_20240722::AsciiStrToUpper_abi_cxx11_
                    (&local_338,(lts_20240722 *)local_348._M_len,s_01);
          uVar11 = SUB81(pcVar12,0);
          iVar5 = FieldDescriptor::number(key);
          absl::lts_20240722::AlphaNum::AlphaNum(&local_398,iVar5);
          absl::lts_20240722::StrCat_abi_cxx11_(&local_368,(lts_20240722 *)&local_398,a_00);
          (anonymous_namespace)::EnumOrMessageSuffix_abi_cxx11_
                    ((string *)local_3b8,(_anonymous_namespace_ *)key,(FieldDescriptor *)0x1,
                     (bool)uVar11);
          io::Printer::
          Print<char[6],std::__cxx11::string,char[6],std::__cxx11::string,char[5],std::__cxx11::string,char[7],std::__cxx11::string,char[6],std::__cxx11::string>
                    ((Printer *)uVar2,local_2f8,(char (*) [6])0x5a4b86,psVar7,(char (*) [6])"label",
                     &local_318,(char (*) [5])0x61fb6b,&local_338,(char (*) [7])0x6bb261,&local_368,
                     (char (*) [6])"other",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3b8)
          ;
          std::__cxx11::string::~string((string *)local_3b8);
          std::__cxx11::string::~string((string *)&local_368);
          std::__cxx11::string::~string((string *)&local_338);
          std::__cxx11::string::~string((string *)&local_318);
        }
      }
      field._4_4_ = field._4_4_ + 1;
    }
    oneof._4_4_ = 0;
    while( true ) {
      iVar5 = oneof._4_4_;
      iVar6 = Descriptor::real_oneof_decl_count(message);
      uVar2 = class_name.field_2._8_8_;
      if (iVar6 <= iVar5) break;
      local_3c8 = Descriptor::oneof_decl(message,oneof._4_4_);
      uVar2 = class_name.field_2._8_8_;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)auStack_3d8,"->oneof(^name^)\n"
                );
      psVar7 = OneofDescriptor::name_abi_cxx11_(local_3c8);
      io::Printer::Print<char[5],std::__cxx11::string>
                ((Printer *)uVar2,_auStack_3d8,(char (*) [5])0x6b980f,psVar7);
      Indent((Printer *)class_name.field_2._8_8_);
      field_1._4_4_ = 0;
      while( true ) {
        iVar5 = field_1._4_4_;
        uVar4 = OneofDescriptor::field_count(local_3c8);
        uVar2 = class_name.field_2._8_8_;
        pcVar12 = (char *)(ulong)uVar4;
        if ((int)uVar4 <= iVar5) break;
        local_3e8 = OneofDescriptor::field(local_3c8,field_1._4_4_);
        uVar2 = class_name.field_2._8_8_;
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (&local_3f8,
                   "->value(\'^field^\', \\Google\\Protobuf\\Internal\\GPBType::^type^, ^number^^other^)\n"
                  );
        psVar7 = FieldDescriptor::name_abi_cxx11_(local_3e8);
        pcVar10 = FieldDescriptor::type_name(local_3e8);
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_428,pcVar10)
        ;
        s_02._M_str = pcVar12;
        s_02._M_len = (size_t)local_428._M_str;
        absl::lts_20240722::AsciiStrToUpper_abi_cxx11_
                  (&local_418,(lts_20240722 *)local_428._M_len,s_02);
        uVar11 = SUB81(pcVar12,0);
        iVar5 = FieldDescriptor::number(local_3e8);
        absl::lts_20240722::AlphaNum::AlphaNum(&local_478,iVar5);
        absl::lts_20240722::StrCat_abi_cxx11_(&local_448,(lts_20240722 *)&local_478,a_01);
        (anonymous_namespace)::EnumOrMessageSuffix_abi_cxx11_
                  (&local_498,(_anonymous_namespace_ *)local_3e8,(FieldDescriptor *)0x1,(bool)uVar11
                  );
        io::Printer::
        Print<char[6],std::__cxx11::string,char[5],std::__cxx11::string,char[7],std::__cxx11::string,char[6],std::__cxx11::string>
                  ((Printer *)uVar2,local_3f8,(char (*) [6])0x5a4b86,psVar7,(char (*) [5])0x61fb6b,
                   &local_418,(char (*) [7])0x6bb261,&local_448,(char (*) [6])"other",&local_498);
        std::__cxx11::string::~string((string *)&local_498);
        std::__cxx11::string::~string((string *)&local_448);
        std::__cxx11::string::~string((string *)&local_418);
        field_1._4_4_ = field_1._4_4_ + 1;
      }
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_4a8,"->finish()\n");
      io::Printer::Print<>((Printer *)uVar2,local_4a8);
      Outdent((Printer *)class_name.field_2._8_8_);
      oneof._4_4_ = oneof._4_4_ + 1;
    }
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_4b8,"->finalizeToPool();\n");
    io::Printer::Print<>((Printer *)uVar2,local_4b8);
    Outdent((Printer *)class_name.field_2._8_8_);
    uVar2 = class_name.field_2._8_8_;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)auStack_4c8,"\n");
    io::Printer::Print<>((Printer *)uVar2,_auStack_4c8);
    local_4cc = 0;
    while( true ) {
      iVar5 = Descriptor::nested_type_count(message);
      if (iVar5 <= local_4cc) break;
      sVar1 = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_48);
      message_00 = Descriptor::nested_type(message,local_4cc);
      GenerateMessageToPool(sVar1,message_00,(Printer *)class_name.field_2._8_8_);
      local_4cc = local_4cc + 1;
    }
    local_4e4 = 0;
    while( true ) {
      iVar5 = Descriptor::enum_type_count(message);
      if (iVar5 <= local_4e4) break;
      en = Descriptor::enum_type(message,local_4e4);
      GenerateEnumToPool(en,(Printer *)class_name.field_2._8_8_);
      local_4e4 = local_4e4 + 1;
    }
    std::__cxx11::string::~string((string *)local_48);
  }
  return;
}

Assistant:

void GenerateMessageToPool(absl::string_view name_prefix,
                           const Descriptor* message, io::Printer* printer) {
  // Don't generate MapEntry messages -- we use the PHP extension's native
  // support for map fields instead.
  if (message->options().map_entry()) {
    return;
  }
  std::string class_name = absl::StrCat(
      name_prefix.empty() ? "" : absl::StrCat(name_prefix, "\\"),
      ReservedNamePrefix(message->name(), message->file()), message->name());

  printer->Print(
      "$pool->addMessage('^message^', "
      "\\Google\\Protobuf\\Internal\\^class_name^::class)\n",
      "message", DescriptorFullName(message, true), "class_name", class_name);

  Indent(printer);

  for (int i = 0; i < message->field_count(); i++) {
    const FieldDescriptor* field = message->field(i);
    if (field->is_map()) {
      const FieldDescriptor* key = field->message_type()->map_key();
      const FieldDescriptor* val = field->message_type()->map_value();
      printer->Print(
          "->map('^field^', \\Google\\Protobuf\\Internal\\GPBType::^key^, "
          "\\Google\\Protobuf\\Internal\\GPBType::^value^, ^number^^other^)\n",
          "field", field->name(), "key",
          absl::AsciiStrToUpper(key->type_name()), "value",
          absl::AsciiStrToUpper(val->type_name()), "number",
          absl::StrCat(field->number()), "other",
          EnumOrMessageSuffix(val, true));
    } else if (!field->real_containing_oneof()) {
      printer->Print(
          "->^label^('^field^', "
          "\\Google\\Protobuf\\Internal\\GPBType::^type^, ^number^^other^)\n",
          "field", field->name(), "label", LabelForField(field), "type",
          absl::AsciiStrToUpper(field->type_name()), "number",
          absl::StrCat(field->number()), "other",
          EnumOrMessageSuffix(field, true));
    }
  }

  // oneofs.
  for (int i = 0; i < message->real_oneof_decl_count(); i++) {
    const OneofDescriptor* oneof = message->oneof_decl(i);
    printer->Print("->oneof(^name^)\n", "name", oneof->name());
    Indent(printer);
    for (int index = 0; index < oneof->field_count(); index++) {
      const FieldDescriptor* field = oneof->field(index);
      printer->Print(
          "->value('^field^', "
          "\\Google\\Protobuf\\Internal\\GPBType::^type^, ^number^^other^)\n",
          "field", field->name(), "type",
          absl::AsciiStrToUpper(field->type_name()), "number",
          absl::StrCat(field->number()), "other",
          EnumOrMessageSuffix(field, true));
    }
    printer->Print("->finish()\n");
    Outdent(printer);
  }

  printer->Print("->finalizeToPool();\n");

  Outdent(printer);

  printer->Print("\n");

  for (int i = 0; i < message->nested_type_count(); i++) {
    GenerateMessageToPool(class_name, message->nested_type(i), printer);
  }
  for (int i = 0; i < message->enum_type_count(); i++) {
    GenerateEnumToPool(message->enum_type(i), printer);
  }
}